

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

uint32_t __thiscall
asmjit::v1_14::CodeHolder::labelIdByName
          (CodeHolder *this,char *name,size_t nameSize,uint32_t parentId)

{
  uint32_t uVar1;
  int iVar2;
  void *__s1;
  uint uVar3;
  long *plVar4;
  ulong __n;
  size_t nameSize_local;
  
  nameSize_local = nameSize;
  uVar1 = CodeHolder_hashNameAndGetSize(name,&nameSize_local);
  if (nameSize_local == 0) {
    uVar1 = 0;
  }
  else {
    uVar3 = 0;
    if (parentId != 0xffffffff) {
      uVar3 = parentId;
    }
    plVar4 = *(long **)(*(long *)&this->_namedLabels +
                       (ulong)((uVar1 ^ uVar3) -
                              (int)((ulong)*(uint *)&this->field_0x130 * (ulong)(uVar1 ^ uVar3) >>
                                   (this->field_0x134 & 0x3f)) * *(int *)&this->field_0x128) * 8);
    uVar1 = 0xffffffff;
    if (plVar4 != (long *)0x0) {
      uVar3 = (uint)nameSize_local;
      __n = nameSize_local & 0xffffffff;
      do {
        if ((*(uint *)(plVar4 + 6) == uVar3) && (*(uint32_t *)((long)plVar4 + 0x14) == parentId)) {
          if (uVar3 < 0xc) {
            __s1 = (void *)((long)plVar4 + 0x34);
          }
          else {
            __s1 = (void *)plVar4[7];
          }
          iVar2 = bcmp(__s1,name,__n);
          if (iVar2 == 0) {
            return *(uint32_t *)((long)plVar4 + 0xc);
          }
        }
        plVar4 = (long *)*plVar4;
      } while (plVar4 != (long *)0x0);
    }
  }
  return uVar1;
}

Assistant:

uint32_t CodeHolder::labelIdByName(const char* name, size_t nameSize, uint32_t parentId) noexcept {
  uint32_t hashCode = CodeHolder_hashNameAndGetSize(name, nameSize);
  if (ASMJIT_UNLIKELY(!nameSize))
    return 0;

  if (parentId != Globals::kInvalidId)
    hashCode ^= parentId;

  LabelEntry* le = _namedLabels.get(LabelByName(name, nameSize, hashCode, parentId));
  return le ? le->id() : uint32_t(Globals::kInvalidId);
}